

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
KickBanIRCCommand::trigger
          (KickBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  Server **server;
  long *plVar7;
  string_view name;
  string banner;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  string local_b8;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long *local_68;
  long local_60;
  size_t local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  pcVar5 = nick._M_str;
  pcVar2 = channel._M_str;
  sVar3 = channel._M_len;
  if (parameters._M_len != 0) {
    pcVar4 = pcVar5;
    lVar1 = Jupiter::IRC::Client::getChannel(source,sVar3,pcVar2);
    if (lVar1 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&local_70);
      if (local_68 == local_70) {
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      else {
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  (&local_50,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len,
                   " \t","",pcVar4);
        local_58 = 9;
        if (local_50.second._M_len != 0) {
          local_58 = local_50.second._M_len;
        }
        pcVar4 = "No reason";
        if (local_50.second._M_len != 0) {
          pcVar4 = local_50.second._M_str;
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar5,pcVar5 + nick._M_len);
        local_98 = pcVar2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_90,"@IRC");
        uVar6 = 0;
        for (plVar7 = local_70; plVar7 != local_68; plVar7 = plVar7 + 1) {
          if (*plVar7 != 0) {
            lVar1 = RenX::Server::getPlayerByPartName
                              (*plVar7,local_50.first._M_len,local_50.first._M_str);
            if (lVar1 != 0) {
              RenX::Server::banPlayer
                        (*plVar7,lVar1,local_90._M_string_length,local_90._M_dataplus._M_p,local_58,
                         pcVar4,0);
              uVar6 = uVar6 + 1;
            }
          }
        }
        if (uVar6 == 0) {
          name._M_str = local_50.first._M_str;
          name._M_len = local_50.first._M_len;
          player_not_found_message_abi_cxx11_(&local_b8,name);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,local_98,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          string_printf_abi_cxx11_(&local_b8,"%u players kicked.",(ulong)uVar6);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,local_98,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          RenX::getCore();
          RenX::Core::banCheck();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_70 != (long *)0x0) {
        operator_delete(local_70,local_60 - (long)local_70);
      }
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,nick._M_len,pcVar5,0x3c,
             "Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]");
  return;
}

Assistant:

void KickBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			const auto& servers = RenX::getCore()->getServers(chan->getType());
			if (servers.size() != 0)
			{
				RenX::PlayerInfo *player;
				unsigned int kicks = 0;
				auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
				std::string_view name = command_split.first;
				std::string_view reason = command_split.second;
				if (reason.empty()) {
					reason = "No reason"sv;
				}

				std::string banner{ nick };
				banner += "@IRC";
				for (const auto& server : servers) {
					if (server != nullptr) {
						player = server->getPlayerByPartName(name);
						if (player != nullptr) {
							server->banPlayer(*player, banner, reason);
							kicks++;
						}
					}
				}
				if (kicks == 0) {
					source->sendMessage(channel, player_not_found_message(name));
				}
				else {
					source->sendMessage(channel, string_printf("%u players kicked.", kicks));
					RenX::getCore()->banCheck();
				}
			}
			else source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]"sv);
}